

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDefaults.cpp
# Opt level: O1

int helics::getDefaultPort(int coreType)

{
  int iVar1;
  
  iVar1 = -1;
  if (coreType - 1U < 0xe) {
    iVar1 = *(int *)(&DAT_003e98e0 + (ulong)(coreType - 1U) * 4);
  }
  return iVar1;
}

Assistant:

int getDefaultPort(int coreType)
{
    switch (coreType) {
        case HELICS_CORE_TYPE_TCP:
            return network::DEFAULT_TCP_PORT;
        case HELICS_CORE_TYPE_TCP_SS:
            return network::DEFAULT_TCPSS_PORT;
        case HELICS_CORE_TYPE_ZMQ:
            return network::DEFAULT_ZMQ_PORT;
        case HELICS_CORE_TYPE_ZMQ_SS:
            return network::DEFAULT_ZMQSS_PORT;
        case HELICS_CORE_TYPE_UDP:
            return network::DEFAULT_UDP_PORT;
        case HELICS_CORE_TYPE_HTTP:
        case HELICS_CORE_TYPE_WEBSOCKET:
            return 80;
        default:
            return (-1);
    }
}